

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_sjasm.cpp
# Opt level: O2

bool lua_zx_trdimage_create(char *trdname,char *label)

{
  char cVar1;
  bool bVar2;
  int to_remove;
  long lVar3;
  char l8 [9];
  char *local_40;
  path local_38;
  
  builtin_strncpy(l8,"        ",9);
  for (lVar3 = 0;
      ((label + lVar3 != (char *)0x0 && (cVar1 = label[lVar3], cVar1 != '\0')) && (lVar3 < 8));
      lVar3 = lVar3 + 1) {
    l8[lVar3] = cVar1;
  }
  to_remove = addLuaSourcePositions();
  local_40 = "";
  if (trdname != (char *)0x0) {
    local_40 = trdname;
  }
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_38,&local_40,auto_format);
  bVar2 = TRD_SaveEmpty(&local_38,l8);
  std::filesystem::__cxx11::path::~path(&local_38);
  removeLuaSourcePositions(to_remove);
  return bVar2;
}

Assistant:

static bool lua_zx_trdimage_create(const char* trdname, const char* label = nullptr) {
	// setup label to truncated 8 char array padded with spaces
	char l8[9] = "        ";
	char* l8_ptr = l8;
	while (label && *label && (l8_ptr - l8) < 8) *l8_ptr++ = *label++;
	int positionsAdded = addLuaSourcePositions();	// add known script positions to sourcePosStack vector
	bool result = TRD_SaveEmpty(trdname ? trdname : "", l8);
	removeLuaSourcePositions(positionsAdded);
	return result;
}